

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerApp.cpp
# Opt level: O3

void __thiscall
helics::BrokerApp::BrokerApp
          (BrokerApp *this,CoreType ctype,string *broker_name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pcVar1;
  ParseOutput PVar2;
  _Head_base<0UL,_helics::helicsCLI11App_*,_false> local_30;
  
  (this->broker).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->broker).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (broker_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar1,pcVar1 + broker_name->_M_string_length);
  generateParser((BrokerApp *)&local_30,SUB81(this,0));
  (local_30._M_head_impl)->coreType = ctype;
  (local_30._M_head_impl)->passConfig = true;
  PVar2 = helicsCLI11App::
          helics_parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
                    (local_30._M_head_impl,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)args);
  if (PVar2 == OK) {
    processArgs(this,(unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                      *)&local_30);
  }
  if (local_30._M_head_impl != (helicsCLI11App *)0x0) {
    (*((local_30._M_head_impl)->super_App)._vptr_App[1])();
  }
  return;
}

Assistant:

BrokerApp::BrokerApp(CoreType ctype,
                     const std::string& broker_name,
                     std::vector<std::string>& args): name(broker_name)
{
    auto app = generateParser(ctype == CoreType::MULTI);
    app->setDefaultCoreType(ctype);
    app->passConfig = true;
    if (app->helics_parse(args) == helicsCLI11App::ParseOutput::OK) {
        processArgs(app);
    }
}